

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

void canvas_popabstraction(_glist *x)

{
  t_pd *x_00;
  t_symbol *ptVar1;
  
  pd_maininstance.pd_newest = (t_pd *)x;
  ptVar1 = gensym("#A");
  ptVar1->s_thing = (_class **)0x0;
  x_00 = pd_maininstance.pd_newest;
  ptVar1 = gensym("#A");
  pd_bind(x_00,ptVar1);
  pd_popsym((t_pd *)x);
  x->field_0xe8 = x->field_0xe8 & 0xf7;
  canvas_resortinlets(x);
  canvas_resortoutlets(x);
  return;
}

Assistant:

void canvas_popabstraction(t_canvas *x)
{
    pd_this->pd_newest = &x->gl_pd;
    gensym("#A")->s_thing = 0;
    pd_bind(pd_this->pd_newest, gensym("#A"));
    pd_popsym(&x->gl_pd);
    x->gl_loading = 0;
    canvas_resortinlets(x);
    canvas_resortoutlets(x);
}